

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglibnetworkinformationbackend.cpp
# Opt level: O0

void __thiscall
QGlibNetworkInformationBackend::QGlibNetworkInformationBackend(QGlibNetworkInformationBackend *this)

{
  GNetworkMonitor *pGVar1;
  gulong gVar2;
  QGlibNetworkInformationBackend *in_RDI;
  
  QNetworkInformationBackend::QNetworkInformationBackend(&in_RDI->super_QNetworkInformationBackend);
  *(undefined ***)in_RDI = &PTR_metaObject_00107a70;
  pGVar1 = (GNetworkMonitor *)g_network_monitor_get_default();
  in_RDI->networkMonitor = pGVar1;
  in_RDI->connectivityHandlerId = 0;
  in_RDI->meteredHandlerId = 0;
  updateConnectivity(in_RDI);
  updateMetered(in_RDI);
  gVar2 = g_signal_connect_data
                    (in_RDI->networkMonitor,"notify::connectivity",updateConnectivity,in_RDI,0,2);
  in_RDI->connectivityHandlerId = gVar2;
  gVar2 = g_signal_connect_data
                    (in_RDI->networkMonitor,"notify::network-metered",updateMetered,in_RDI,0,2);
  in_RDI->meteredHandlerId = gVar2;
  return;
}

Assistant:

QGlibNetworkInformationBackend::QGlibNetworkInformationBackend()
: networkMonitor(g_network_monitor_get_default())
{
    updateConnectivity(this);
    updateMetered(this);

    connectivityHandlerId = g_signal_connect_swapped(networkMonitor, "notify::connectivity",
                                                     G_CALLBACK(updateConnectivity), this);

    meteredHandlerId = g_signal_connect_swapped(networkMonitor, "notify::network-metered",
                                                G_CALLBACK(updateMetered), this);
}